

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

size_t release_unused_segments(mstate m)

{
  int iVar1;
  void *__addr;
  size_t __len;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  long *plVar10;
  long in_RDI;
  bool bVar11;
  tchunkptr F_1;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I;
  tbinptr *H_1;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr tp;
  size_t psize;
  mchunkptr p;
  msegmentptr next;
  size_t size;
  char *base;
  msegmentptr sp;
  msegmentptr pred;
  size_t nsegs;
  size_t released;
  int ret;
  int olderr;
  ulong local_118;
  byte local_110;
  ulong local_f8;
  long local_d8;
  long local_d0;
  ulong local_c0;
  long *local_98;
  long *local_90;
  long local_80;
  undefined8 *local_40;
  undefined8 *local_38;
  ulong local_30;
  size_t local_28;
  
  local_28 = 0;
  local_30 = 0;
  local_38 = (undefined8 *)(in_RDI + 0x348);
  local_40 = *(undefined8 **)(in_RDI + 0x358);
  do {
    if (local_40 == (undefined8 *)0x0) {
      if (local_30 < 0x100) {
        local_118 = 0xff;
      }
      else {
        local_118 = local_30;
      }
      *(ulong *)(in_RDI + 0x30) = local_118;
      return local_28;
    }
    __addr = (void *)*local_40;
    __len = local_40[1];
    puVar2 = (undefined8 *)local_40[2];
    local_30 = local_30 + 1;
    if (((long)__addr + 0x10U & 7) == 0) {
      local_f8 = 0;
    }
    else {
      local_f8 = 8 - ((long)__addr + 0x10U & 7) & 7;
    }
    lVar7 = (long)__addr + local_f8;
    uVar8 = *(ulong *)(lVar7 + 8) & 0xfffffffffffffffc;
    if (((*(ulong *)(lVar7 + 8) & 2) == 0) && ((long)__addr + (__len - 0x40) <= lVar7 + uVar8)) {
      if (lVar7 == *(long *)(in_RDI + 0x18)) {
        *(undefined8 *)(in_RDI + 0x18) = 0;
        *(undefined8 *)(in_RDI + 8) = 0;
      }
      else {
        lVar4 = *(long *)(lVar7 + 0x30);
        if (*(long *)(lVar7 + 0x18) == lVar7) {
          local_90 = (long *)(lVar7 + 0x28);
          local_80 = *(long *)(lVar7 + 0x28);
          if (local_80 == 0) {
            local_90 = (long *)(lVar7 + 0x20);
            local_80 = *(long *)(lVar7 + 0x20);
            if (local_80 == 0) goto LAB_00180ad9;
          }
          while( true ) {
            local_98 = (long *)(local_80 + 0x28);
            bVar11 = true;
            if (*(long *)(local_80 + 0x28) == 0) {
              local_98 = (long *)(local_80 + 0x20);
              bVar11 = *(long *)(local_80 + 0x20) != 0;
            }
            if (!bVar11) break;
            local_90 = local_98;
            local_80 = *local_98;
          }
          *local_90 = 0;
        }
        else {
          lVar3 = *(long *)(lVar7 + 0x10);
          local_80 = *(long *)(lVar7 + 0x18);
          *(long *)(lVar3 + 0x18) = local_80;
          *(long *)(local_80 + 0x10) = lVar3;
        }
LAB_00180ad9:
        if (lVar4 != 0) {
          plVar10 = (long *)(in_RDI + 0x248 + *(long *)(lVar7 + 0x38) * 8);
          if (lVar7 == *plVar10) {
            *plVar10 = local_80;
            if (local_80 == 0) {
              *(uint *)(in_RDI + 4) =
                   (1 << ((byte)*(undefined8 *)(lVar7 + 0x38) & 0x1f) ^ 0xffffffffU) &
                   *(uint *)(in_RDI + 4);
            }
          }
          else if (*(long *)(lVar4 + 0x20) == lVar7) {
            *(long *)(lVar4 + 0x20) = local_80;
          }
          else {
            *(long *)(lVar4 + 0x28) = local_80;
          }
          if (local_80 != 0) {
            *(long *)(local_80 + 0x30) = lVar4;
            lVar4 = *(long *)(lVar7 + 0x20);
            if (lVar4 != 0) {
              *(long *)(local_80 + 0x20) = lVar4;
              *(long *)(lVar4 + 0x30) = local_80;
            }
            lVar4 = *(long *)(lVar7 + 0x28);
            if (lVar4 != 0) {
              *(long *)(local_80 + 0x28) = lVar4;
              *(long *)(lVar4 + 0x30) = local_80;
            }
          }
        }
      }
      piVar9 = __errno_location();
      iVar1 = *piVar9;
      iVar5 = munmap(__addr,__len);
      piVar9 = __errno_location();
      *piVar9 = iVar1;
      if (iVar5 == 0) {
        local_28 = __len + local_28;
        local_40 = local_38;
        local_38[2] = puVar2;
      }
      else {
        uVar6 = (uint)(uVar8 >> 8);
        if (uVar6 == 0) {
          local_c0 = 0;
        }
        else if (uVar6 < 0x10000) {
          iVar1 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          local_c0 = (ulong)(uint)(iVar1 << 1) + (uVar8 >> ((char)iVar1 + 7U & 0x3f) & 1);
        }
        else {
          local_c0 = 0x1f;
        }
        plVar10 = (long *)(in_RDI + 0x248 + local_c0 * 8);
        *(ulong *)(lVar7 + 0x38) = local_c0;
        *(undefined8 *)(lVar7 + 0x28) = 0;
        *(undefined8 *)(lVar7 + 0x20) = 0;
        if ((*(uint *)(in_RDI + 4) & 1 << ((byte)local_c0 & 0x1f)) == 0) {
          *(uint *)(in_RDI + 4) = 1 << ((byte)local_c0 & 0x1f) | *(uint *)(in_RDI + 4);
          *plVar10 = lVar7;
          *(long **)(lVar7 + 0x30) = plVar10;
          *(long *)(lVar7 + 0x18) = lVar7;
          *(long *)(lVar7 + 0x10) = lVar7;
        }
        else {
          local_d0 = *plVar10;
          if (local_c0 == 0x1f) {
            local_110 = 0;
          }
          else {
            local_110 = 0x3f - ((char)(local_c0 >> 1) + '\x06');
          }
          local_d8 = uVar8 << (local_110 & 0x3f);
          while ((*(ulong *)(local_d0 + 8) & 0xfffffffffffffffc) != uVar8) {
            plVar10 = (long *)(local_d0 + 0x20 + (local_d8 >> 0x3f) * -8);
            local_d8 = local_d8 << 1;
            if (*plVar10 == 0) {
              *plVar10 = lVar7;
              *(long *)(lVar7 + 0x30) = local_d0;
              *(long *)(lVar7 + 0x18) = lVar7;
              *(long *)(lVar7 + 0x10) = lVar7;
              goto LAB_00180f9b;
            }
            local_d0 = *plVar10;
          }
          lVar4 = *(long *)(local_d0 + 0x10);
          *(long *)(lVar4 + 0x18) = lVar7;
          *(long *)(local_d0 + 0x10) = lVar7;
          *(long *)(lVar7 + 0x10) = lVar4;
          *(long *)(lVar7 + 0x18) = local_d0;
          *(undefined8 *)(lVar7 + 0x30) = 0;
        }
      }
    }
LAB_00180f9b:
    local_38 = local_40;
    local_40 = puVar2;
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m)
{
  size_t released = 0;
  size_t nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char *base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    nsegs++;
    {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!cinuse(p) && (char *)p + psize >= base + size - TOP_FOOT_SIZE) {
	tchunkptr tp = (tchunkptr)p;
	if (p == m->dv) {
	  m->dv = 0;
	  m->dvsize = 0;
	} else {
	  unlink_large_chunk(m, tp);
	}
	if (CALL_MUNMAP(base, size) == 0) {
	  released += size;
	  /* unlink obsoleted record */
	  sp = pred;
	  sp->next = next;
	} else { /* back out if cannot unmap */
	  insert_large_chunk(m, tp, psize);
	}
      }
    }
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = nsegs > MAX_RELEASE_CHECK_RATE ?
		      nsegs : MAX_RELEASE_CHECK_RATE;
  return released;
}